

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate1.hpp
# Opt level: O2

void __thiscall qclab::qgates::QGate1<double>::QGate1(QGate1<double> *this)

{
  (this->super_QObject<double>)._vptr_QObject = (_func_int **)&PTR_nbQubits_004cc288;
  this->qubit_ = 0;
  return;
}

Assistant:

QGate1( const int qubit )
        : qubit_( qubit )
        {
          assert( qubit >= 0 ) ;
        }